

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<kj::Promise<void>_> __thiscall
kj::anon_unknown_36::HttpClientAdapter::DelayedCloseWebSocket::tryPumpFrom
          (DelayedCloseWebSocket *this,WebSocket *other)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  OwnPromiseNode OVar2;
  void *pvVar3;
  long *in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 extraout_RDX;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6981:40)>
  *location_00;
  Maybe<kj::Promise<void>_> MVar4;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_70;
  anon_class_8_1_8991fb9c_for_func local_68;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_60;
  code *local_58;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_50;
  OwnPromiseNode local_48;
  undefined *local_40;
  undefined *puStack_38;
  undefined8 local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  (**(code **)(*in_RDX + 0x38))(&local_70);
  local_58 = kj::_::
             SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6981:40)>
             ::anon_class_8_1_8991fb9c_for_func::operator();
  pPVar1 = ((local_70.ptr)->super_PromiseArenaMember).arena;
  local_68.this = (DelayedCloseWebSocket *)other;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_70.ptr - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6981:40)>
                   *)((long)pvVar3 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket::tryPumpFrom(kj::WebSocket&)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket::tryPumpFrom(kj::WebSocket&)::_lambda()_1_,void*&>
              (location_00,&local_70,&local_68,&local_58);
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    ((local_70.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6981:40)>
                   *)&local_70.ptr[-3].super_PromiseArenaMember.arena;
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket::tryPumpFrom(kj::WebSocket&)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket::tryPumpFrom(kj::WebSocket&)::_lambda()_1_,void*&>
              (location_00,&local_70,&local_68,&local_58);
    local_70.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_40 = &DAT_0042a172;
  puStack_38 = &DAT_0042a1d1;
  local_30 = 0x4c0000058b;
  location.function = &DAT_0042a1d1;
  location.fileName = &DAT_0042a172;
  location.lineNumber = 0x58b;
  location.columnNumber = 0x4c;
  local_60.ptr = (PromiseNode *)location_00;
  kj::_::maybeChain<void>(&local_48,(Promise<void> *)&local_60,location);
  OVar2.ptr = local_48.ptr;
  local_48.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_48);
  local_50.ptr = OVar2.ptr;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_60);
  *(undefined1 *)&(this->super_WebSocket)._vptr_WebSocket = 1;
  (this->inner).disposer = (Disposer *)OVar2.ptr;
  local_50.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_50);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_70);
  MVar4.ptr.field_1 = extraout_RDX;
  MVar4.ptr._0_8_ = this;
  return (Maybe<kj::Promise<void>_>)MVar4.ptr;
}

Assistant:

kj::Maybe<kj::Promise<void>> tryPumpFrom(WebSocket& other) override {
      return other.pumpTo(*inner).then([this]() {
        return afterSendClosed();
      });
    }